

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savefile.c
# Opt level: O3

_Bool check_header(ang_file *f)

{
  _Bool _Var1;
  int iVar2;
  undefined8 in_RAX;
  uint8_t head [8];
  undefined8 local_8;
  
  local_8 = in_RAX;
  iVar2 = file_read(f,(char *)&local_8,8);
  if (((iVar2 == 8) && ((int)local_8 == 0x65766153)) && (local_8._4_4_ == 0x414c4e56)) {
    _Var1 = true;
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool check_header(ang_file *f) {
	uint8_t head[8];

	if (file_read(f, (char *) &head, 8) == 8 &&
			memcmp(&head[0], savefile_magic, 4) == 0 &&
			memcmp(&head[4], savefile_name, 4) == 0)
		return true;

	return false;
}